

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.c
# Opt level: O0

void test_close(void)

{
  long lVar1;
  quicly_closed_by_remote_t *pqVar2;
  int iVar3;
  quicly_state_t qVar4;
  int64_t iVar5;
  ulong uVar6;
  bool bVar7;
  uint64_t auStack_150 [3];
  int64_t local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  uint64_t local_120 [2];
  quicly_decoded_packet_t decoded;
  int64_t iStack_88;
  int ret;
  int64_t server_timeout;
  int64_t client_timeout;
  size_t num_datagrams;
  unsigned_long __vla_expr0;
  iovec datagram;
  quicly_address_t src;
  quicly_address_t dest;
  quicly_closed_by_remote_t *orig_closed_by_remote;
  quicly_closed_by_remote_t closed_by_remote;
  
  pqVar2 = quic_ctx.closed_by_remote;
  orig_closed_by_remote = (quicly_closed_by_remote_t *)test_closed_by_remote;
  local_120[0] = quic_ctx.transport_params.max_udp_payload_size;
  __vla_expr0 = (unsigned_long)&local_138;
  lVar1 = -(quic_ctx.transport_params.max_udp_payload_size + 0xf & 0xfffffffffffffff0);
  local_128 = (long)&local_138 + lVar1;
  num_datagrams = quic_ctx.transport_params.max_udp_payload_size;
  quic_ctx.closed_by_remote = (quicly_closed_by_remote_t *)&orig_closed_by_remote;
  *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139bb3;
  iVar3 = quicly_close(*(quicly_conn_t **)((long)local_120 + lVar1),
                       *(int *)((long)&local_128 + lVar1 + 4),*(char **)((long)&uStack_130 + lVar1))
  ;
  decoded._132_4_ = iVar3;
  *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139be2;
  _ok((int)(ulong)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
      0x1e7);
  *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139bee;
  qVar4 = quicly_get_state(client);
  *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139c13;
  _ok((int)(ulong)(qVar4 == QUICLY_STATE_CLOSING),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
      0x1e8);
  *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139c1f;
  iVar5 = quicly_get_first_timeout(*(quicly_conn_t **)((long)&local_128 + lVar1));
  *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139c4b;
  _ok((int)(ulong)(iVar5 <= quic_now),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
      0x1e9);
  client_timeout = 1;
  *(uint64_t *)((long)auStack_150 + lVar1 + 8) = local_120[0];
  *(undefined8 *)((long)auStack_150 + lVar1) = 0x139c85;
  decoded._132_4_ =
       quicly_send(*(quicly_conn_t **)((long)&server_timeout + lVar1),
                   *(quicly_address_t **)((long)&stack0xffffffffffffff78 + lVar1),
                   *(quicly_address_t **)((long)&decoded + lVar1 + 0x80),
                   *(iovec **)((long)&decoded + lVar1 + 0x78),
                   *(size_t **)((long)&decoded + lVar1 + 0x70),
                   *(void **)((long)&decoded + lVar1 + 0x68),
                   *(size_t *)((long)&num_datagrams + lVar1));
  if (client_timeout == 1) {
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139cc3;
    server_timeout = quicly_get_first_timeout(*(quicly_conn_t **)((long)&local_128 + lVar1));
    uStack_130._7_1_ = false;
    if (quic_now < server_timeout) {
      uStack_130._7_1_ = server_timeout < quic_now + 1000;
    }
    uVar6 = (ulong)(byte)uStack_130._7_1_;
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139d25;
    _ok((int)uVar6,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1ee);
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139d3a;
    decode_packets(*(quicly_decoded_packet_t **)((long)&decoded + lVar1),
                   *(iovec **)((long)local_120 + lVar1 + 8),*(size_t *)((long)local_120 + lVar1));
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139d58;
    iVar3 = quicly_receive(*(quicly_conn_t **)((long)&num_datagrams + lVar1),
                           *(sockaddr **)((long)&client_timeout + lVar1),
                           *(sockaddr **)((long)&server_timeout + lVar1),
                           *(quicly_decoded_packet_t **)((long)&stack0xffffffffffffff78 + lVar1));
    decoded._132_4_ = iVar3;
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139d87;
    _ok((int)(ulong)(iVar3 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        500);
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139db5;
    _ok((int)(ulong)(test_close_error_code == 0x3039),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1f5);
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139dc1;
    qVar4 = quicly_get_state(server);
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139de6;
    _ok((int)(ulong)(qVar4 == QUICLY_STATE_DRAINING),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1f6);
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139df2;
    iStack_88 = quicly_get_first_timeout(*(quicly_conn_t **)((long)&local_128 + lVar1));
    uStack_130._6_1_ = false;
    if (quic_now < iStack_88) {
      uStack_130._6_1_ = iStack_88 < quic_now + 1000;
    }
    uVar6 = (ulong)(byte)uStack_130._6_1_;
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139e54;
    _ok((int)uVar6,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1f8);
    client_timeout = 1;
    *(uint64_t *)((long)auStack_150 + lVar1 + 8) = local_120[0];
    *(undefined8 *)((long)auStack_150 + lVar1) = 0x139e8e;
    iVar3 = quicly_send(*(quicly_conn_t **)((long)&server_timeout + lVar1),
                        *(quicly_address_t **)((long)&stack0xffffffffffffff78 + lVar1),
                        *(quicly_address_t **)((long)&decoded + lVar1 + 0x80),
                        *(iovec **)((long)&decoded + lVar1 + 0x78),
                        *(size_t **)((long)&decoded + lVar1 + 0x70),
                        *(void **)((long)&decoded + lVar1 + 0x68),
                        *(size_t *)((long)&num_datagrams + lVar1));
    decoded._132_4_ = iVar3;
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139ec1;
    _ok((int)(ulong)(iVar3 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1fe);
    bVar7 = client_timeout == 0;
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139ee8;
    _ok((int)(ulong)bVar7,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1ff);
    if (server_timeout < iStack_88) {
      local_138 = iStack_88;
    }
    else {
      local_138 = server_timeout;
    }
    quic_now = local_138;
    client_timeout = 1;
    *(uint64_t *)((long)auStack_150 + lVar1 + 8) = local_120[0];
    *(undefined8 *)((long)auStack_150 + lVar1) = 0x139f55;
    iVar3 = quicly_send(*(quicly_conn_t **)((long)&server_timeout + lVar1),
                        *(quicly_address_t **)((long)&stack0xffffffffffffff78 + lVar1),
                        *(quicly_address_t **)((long)&decoded + lVar1 + 0x80),
                        *(iovec **)((long)&decoded + lVar1 + 0x78),
                        *(size_t **)((long)&decoded + lVar1 + 0x70),
                        *(void **)((long)&decoded + lVar1 + 0x68),
                        *(size_t *)((long)&num_datagrams + lVar1));
    decoded._132_4_ = iVar3;
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139f8b;
    _ok((int)(ulong)(iVar3 == 0xff03),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x205);
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139f97;
    quicly_free(*(quicly_conn_t **)((long)&uStack_130 + lVar1));
    client_timeout = 1;
    *(uint64_t *)((long)auStack_150 + lVar1 + 8) = local_120[0];
    *(undefined8 *)((long)auStack_150 + lVar1) = 0x139fd1;
    iVar3 = quicly_send(*(quicly_conn_t **)((long)&server_timeout + lVar1),
                        *(quicly_address_t **)((long)&stack0xffffffffffffff78 + lVar1),
                        *(quicly_address_t **)((long)&decoded + lVar1 + 0x80),
                        *(iovec **)((long)&decoded + lVar1 + 0x78),
                        *(size_t **)((long)&decoded + lVar1 + 0x70),
                        *(void **)((long)&decoded + lVar1 + 0x68),
                        *(size_t *)((long)&num_datagrams + lVar1));
    decoded._132_4_ = iVar3;
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x13a007;
    _ok((int)(ulong)(iVar3 == 0xff03),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x209);
    *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x13a013;
    quicly_free(*(quicly_conn_t **)((long)&uStack_130 + lVar1));
    client = (quicly_conn_t *)0x0;
    server = (quicly_conn_t *)0x0;
    quic_ctx.closed_by_remote = pqVar2;
    return;
  }
  *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x139cb7;
  __assert_fail("num_datagrams == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c"
                ,0x1ec,"void test_close(void)");
}

Assistant:

static void test_close(void)
{
    quicly_closed_by_remote_t closed_by_remote = {test_closed_by_remote}, *orig_closed_by_remote = quic_ctx.closed_by_remote;
    quicly_address_t dest, src;
    struct iovec datagram;
    uint8_t datagram_buf[quic_ctx.transport_params.max_udp_payload_size];
    size_t num_datagrams;
    int64_t client_timeout, server_timeout;
    int ret;

    quic_ctx.closed_by_remote = &closed_by_remote;

    /* client sends close */
    ret = quicly_close(client, QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(12345), "good bye");
    ok(ret == 0);
    ok(quicly_get_state(client) == QUICLY_STATE_CLOSING);
    ok(quicly_get_first_timeout(client) <= quic_now);
    num_datagrams = 1;
    ret = quicly_send(client, &dest, &src, &datagram, &num_datagrams, datagram_buf, sizeof(datagram_buf));
    assert(num_datagrams == 1);
    client_timeout = quicly_get_first_timeout(client);
    ok(quic_now < client_timeout && client_timeout < quic_now + 1000); /* 3 pto or something */

    { /* server receives close */
        quicly_decoded_packet_t decoded;
        decode_packets(&decoded, &datagram, 1);
        ret = quicly_receive(server, NULL, &fake_address.sa, &decoded);
        ok(ret == 0);
        ok(test_close_error_code == 12345);
        ok(quicly_get_state(server) == QUICLY_STATE_DRAINING);
        server_timeout = quicly_get_first_timeout(server);
        ok(quic_now < server_timeout && server_timeout < quic_now + 1000); /* 3 pto or something */
    }

    /* nothing sent by the server in response */
    num_datagrams = 1;
    ret = quicly_send(server, &dest, &src, &datagram, &num_datagrams, datagram_buf, sizeof(datagram_buf));
    ok(ret == 0);
    ok(num_datagrams == 0);

    /* endpoints request discarding state after timeout */
    quic_now = client_timeout < server_timeout ? server_timeout : client_timeout;
    num_datagrams = 1;
    ret = quicly_send(client, &dest, &src, &datagram, &num_datagrams, datagram_buf, sizeof(datagram_buf));
    ok(ret == QUICLY_ERROR_FREE_CONNECTION);
    quicly_free(client);
    num_datagrams = 1;
    ret = quicly_send(server, &dest, &src, &datagram, &num_datagrams, datagram_buf, sizeof(datagram_buf));
    ok(ret == QUICLY_ERROR_FREE_CONNECTION);
    quicly_free(server);

    client = NULL;
    server = NULL;
    quic_ctx.closed_by_remote = orig_closed_by_remote;
}